

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

void IoTHubMessaging_LL_SendMessageComplete
               (void *context,MESSAGE_SEND_RESULT send_result,AMQP_VALUE delivery_state)

{
  undefined4 local_2c;
  IOTHUB_MESSAGING_RESULT msg_result;
  SEND_CALLBACK_DATA *send_data;
  AMQP_VALUE delivery_state_local;
  MESSAGE_SEND_RESULT send_result_local;
  void *context_local;
  
  if (context != (void *)0x0) {
    if (*(long *)((long)context + 0x10) != 0) {
      if (send_result == MESSAGE_SEND_OK) {
        local_2c = 0;
      }
      else {
        local_2c = 2;
      }
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),local_2c);
    }
    dequeue_send_callback_data((SEND_CALLBACK_DATA *)context);
  }
  return;
}

Assistant:

static void IoTHubMessaging_LL_SendMessageComplete(void* context, MESSAGE_SEND_RESULT send_result, AMQP_VALUE delivery_state)
{
    (void)delivery_state;
    if (context != NULL)
    {
        SEND_CALLBACK_DATA* send_data = (SEND_CALLBACK_DATA*)context;

        if (send_data->callback != NULL)
        {
            // Convert a MESSAGE_SEND_RESULT to an IOTHUB_MESSAGING_RESULT.
            IOTHUB_MESSAGING_RESULT msg_result;
            switch (send_result)
            {
                case MESSAGE_SEND_OK:
                    msg_result = IOTHUB_MESSAGING_OK;
                    break;
                case MESSAGE_SEND_ERROR:
                case MESSAGE_SEND_TIMEOUT:
                case MESSAGE_SEND_CANCELLED:
                default:
                    msg_result = IOTHUB_MESSAGING_ERROR;
                    break;
            }

            send_data->callback(send_data->userContext, msg_result);
        }

        dequeue_send_callback_data(send_data);
    }
}